

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O3

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::CreateAddNode
          (ScalarEvolutionAnalysis *this,SENode *operand_1,SENode *operand_2)

{
  long lVar1;
  int iVar2;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> tVar3;
  __normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  __position;
  SENode *pSVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  anon_class_8_1_a7bde43c find_first_less_than;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_40;
  SENode *local_38;
  
  iVar2 = (**operand_1->_vptr_SENode)(operand_1);
  if ((iVar2 == 0) && (iVar2 = (**operand_2->_vptr_SENode)(operand_2), iVar2 == 0)) {
    iVar2 = (*operand_1->_vptr_SENode[4])(operand_1);
    lVar1 = *(long *)(CONCAT44(extraout_var,iVar2) + 0x30);
    iVar2 = (*operand_2->_vptr_SENode[4])(operand_2);
    pSVar4 = CreateConstant(this,lVar1 + *(long *)(CONCAT44(extraout_var_00,iVar2) + 0x30));
    return pSVar4;
  }
  iVar2 = (**operand_1->_vptr_SENode)(operand_1);
  if ((iVar2 != 6) && (iVar2 = (**operand_2->_vptr_SENode)(operand_2), iVar2 != 6)) {
    tVar3.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         operator_new(0x30);
    *(long *)((long)tVar3.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
    *(long *)((long)tVar3.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) = 0;
    *(long *)((long)tVar3.
                    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                    .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) = 0;
    *(ScalarEvolutionAnalysis **)
     ((long)tVar3.
            super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
            .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = this;
    SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
    *(int *)((long)tVar3.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
         SENode::NumberOfNodes;
    *(undefined ***)
     tVar3.
     super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
     super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_003e00c0;
    local_38 = operand_1;
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<spvtools::opt::SENode**,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>,__gnu_cxx::__ops::_Iter_negate<spvtools::opt::SENode::AddChild(spvtools::opt::SENode*)::_lambda(spvtools::opt::SENode_const*)_1_>>
                           (0,0,operand_1);
    std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::insert
              ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
               ((long)tVar3.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8),
               (const_iterator)__position._M_current,&local_38);
    (**(code **)(*(long *)tVar3.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18
                ))(tVar3.
                   super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                   .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,operand_2);
    local_40._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
    super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
         tVar3.
         super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
         .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
    pSVar4 = GetCachedOrAdd(this,(unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                                  *)&local_40);
    if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
        local_40._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
        .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl == (SENode *)0x0) {
      return pSVar4;
    }
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10
                ))();
    return pSVar4;
  }
  return this->cached_cant_compute_;
}

Assistant:

SENode* ScalarEvolutionAnalysis::CreateAddNode(SENode* operand_1,
                                               SENode* operand_2) {
  // Fold if both operands are constant and the |simplify| flag is true.
  if (operand_1->GetType() == SENode::Constant &&
      operand_2->GetType() == SENode::Constant) {
    return CreateConstant(operand_1->AsSEConstantNode()->FoldToSingleValue() +
                          operand_2->AsSEConstantNode()->FoldToSingleValue());
  }

  // If operands are can't compute then the whole graph is can't compute.
  if (operand_1->IsCantCompute() || operand_2->IsCantCompute())
    return CreateCantComputeNode();

  std::unique_ptr<SENode> add_node{new SEAddNode(this)};

  add_node->AddChild(operand_1);
  add_node->AddChild(operand_2);

  return GetCachedOrAdd(std::move(add_node));
}